

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BIT_STRING.c
# Opt level: O3

int BIT_STRING_print(asn_TYPE_descriptor_t *td,void *sptr,int ilevel,asn_app_consume_bytes_f *cb,
                    void *app_key)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  char *pcVar4;
  byte *pbVar5;
  char *pcVar6;
  char scratch [64];
  char local_78 [72];
  
  if ((sptr == (void *)0x0) || (pbVar3 = *sptr, pbVar3 == (byte *)0x0)) {
    iVar1 = (*cb)("<absent>",8,app_key);
    iVar1 = iVar1 >> 0x1f;
  }
  else {
    if (0 < (long)*(int *)((long)sptr + 8)) {
      pbVar5 = pbVar3 + *(int *)((long)sptr + 8);
      pcVar4 = local_78;
      do {
        pcVar6 = pcVar4;
        if (((((int)pbVar3 - (int)*sptr & 0xfU) == 0) && (pbVar3 != *sptr)) &&
           (0x10 < *(int *)((long)sptr + 8))) {
          iVar1 = (*cb)("\n",1,app_key);
          if (iVar1 < 0) {
            return -1;
          }
          iVar1 = ilevel + 1;
          if (-1 < ilevel) {
            do {
              iVar2 = (*cb)(" ",1,app_key);
              if (iVar2 < 0) {
                return -1;
              }
              iVar1 = iVar1 + -1;
            } while (iVar1 != 0);
          }
          iVar1 = (*cb)(local_78,(long)pcVar4 - (long)local_78,app_key);
          pcVar6 = local_78;
          if (iVar1 < 0) {
            return -1;
          }
        }
        *pcVar6 = "0123456789ABCDEF"[*pbVar3 >> 4];
        pcVar6[1] = "0123456789ABCDEF"[*pbVar3 & 0xf];
        pcVar4 = pcVar6 + 3;
        pcVar6[2] = ' ';
        pbVar3 = pbVar3 + 1;
      } while (pbVar3 < pbVar5);
      if (local_78 < pcVar4) {
        if (0x10 < *(int *)((long)sptr + 8)) {
          iVar1 = (*cb)("\n",1,app_key);
          if (iVar1 < 0) {
            return -1;
          }
          if (-1 < ilevel) {
            iVar1 = ilevel + 1;
            do {
              iVar2 = (*cb)(" ",1,app_key);
              if (iVar2 < 0) {
                return -1;
              }
              iVar1 = iVar1 + -1;
            } while (iVar1 != 0);
          }
        }
        iVar1 = (*cb)(local_78,(size_t)(pcVar6 + (2 - (long)local_78)),app_key);
        if (iVar1 < 0) {
          return -1;
        }
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
BIT_STRING_print(asn_TYPE_descriptor_t *td, const void *sptr, int ilevel,
		asn_app_consume_bytes_f *cb, void *app_key) {
	const char * const h2c = "0123456789ABCDEF";
	char scratch[64];
	const BIT_STRING_t *st = (const BIT_STRING_t *)sptr;
	uint8_t *buf;
	uint8_t *end;
	char *p = scratch;

	(void)td;	/* Unused argument */

	if(!st || !st->buf)
		return (cb("<absent>", 8, app_key) < 0) ? -1 : 0;

	ilevel++;
	buf = st->buf;
	end = buf + st->size;

	/*
	 * Hexadecimal dump.
	 */
	for(; buf < end; buf++) {
		if((buf - st->buf) % 16 == 0 && (st->size > 16)
				&& buf != st->buf) {
			_i_INDENT(1);
			/* Dump the string */
			if(cb(scratch, p - scratch, app_key) < 0) return -1;
			p = scratch;
		}
		*p++ = h2c[*buf >> 4];
		*p++ = h2c[*buf & 0x0F];
		*p++ = 0x20;
	}

	if(p > scratch) {
		p--;	/* Eat the tailing space */

		if((st->size > 16)) {
			_i_INDENT(1);
		}

		/* Dump the incomplete 16-bytes row */
		if(cb(scratch, p - scratch, app_key) < 0)
			return -1;
	}

	return 0;
}